

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextWrappedV(char *fmt,__va_list_tag *args)

{
  float *pfVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  undefined8 *local_38;
  bool need_backup;
  ImGuiContext *g;
  __va_list_tag *args_local;
  char *fmt_local;
  
  pfVar1 = &(GImGui->CurrentWindow->DC).TextWrapPos;
  bVar3 = *pfVar1 != 0.0;
  bVar4 = *pfVar1 <= 0.0;
  if (bVar4 && bVar3) {
    PushTextWrapPos(0.0);
  }
  if (((*fmt == '%') && (fmt[1] == 's')) && (fmt[2] == '\0')) {
    uVar2 = args->gp_offset;
    if (uVar2 < 0x29) {
      local_38 = (undefined8 *)((long)(int)uVar2 + (long)args->reg_save_area);
      args->gp_offset = uVar2 + 8;
    }
    else {
      local_38 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_38 + 1;
    }
    TextEx((char *)*local_38,(char *)0x0,1);
  }
  else {
    TextV(fmt,args);
  }
  if (bVar4 && bVar3) {
    PopTextWrapPos();
  }
  return;
}

Assistant:

void ImGui::TextWrappedV(const char* fmt, va_list args)
{
    ImGuiContext& g = *GImGui;
    bool need_backup = (g.CurrentWindow->DC.TextWrapPos < 0.0f);  // Keep existing wrap position if one is already set
    if (need_backup)
        PushTextWrapPos(0.0f);
    if (fmt[0] == '%' && fmt[1] == 's' && fmt[2] == 0)
        TextEx(va_arg(args, const char*), NULL, ImGuiTextFlags_NoWidthForLargeClippedText); // Skip formatting
    else
        TextV(fmt, args);
    if (need_backup)
        PopTextWrapPos();
}